

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg2.hpp
# Opt level: O0

void __thiscall trng::mrg2::step(mrg2 *this)

{
  int32_t iVar1;
  long in_RDI;
  uint64_t t;
  
  *(undefined4 *)(in_RDI + 0xc) = *(undefined4 *)(in_RDI + 8);
  iVar1 = int_math::modulo<2147483647,2>(0x107821);
  *(int32_t *)(in_RDI + 8) = iVar1;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg2::step() {
    const uint64_t t{static_cast<uint64_t>(P.a[0]) * static_cast<uint64_t>(S.r[0]) +
                     static_cast<uint64_t>(P.a[1]) * static_cast<uint64_t>(S.r[1])};
    S.r[1] = S.r[0];
    S.r[0] = int_math::modulo<modulus, 2>(t);
  }